

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<int,_QList<int>_>_>::copyAppend
          (QGenericArrayOps<std::pair<int,_QList<int>_>_> *this,pair<int,_QList<int>_> *b,
          pair<int,_QList<int>_> *e)

{
  pair<int,_QList<int>_> *ppVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    ppVar1 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).ptr;
    lVar3 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
    do {
      ppVar1[lVar3].first = b->first;
      pDVar2 = (b->second).d.d;
      ppVar1[lVar3].second.d.d = pDVar2;
      ppVar1[lVar3].second.d.ptr = (b->second).d.ptr;
      ppVar1[lVar3].second.d.size = (b->second).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
      }
      b = b + 1;
      lVar3 = lVar3 + 1;
      (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }